

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  bool bVar1;
  ulong uVar2;
  cmExecutionStatus status;
  cmListFileFunction lff;
  int local_d4;
  string local_d0;
  cmMakefile *local_b0;
  undefined1 local_a8 [96];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_48;
  
  local_a8._0_8_ = local_a8 + 0x10;
  local_a8._8_8_ = 0;
  local_a8[0x10] = '\0';
  local_a8._40_8_ = 0;
  local_a8[0x30] = '\0';
  local_a8._64_8_ = 0;
  local_a8._72_8_ = 0;
  local_a8._80_8_ = 0;
  local_a8._88_8_ = 0;
  local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._32_8_ = local_a8 + 0x30;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,name,(allocator<char> *)&local_d4);
  cmCommandContext::cmCommandName::operator=((cmCommandName *)local_a8,&local_d0);
  local_b0 = (cmMakefile *)arg;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_) !=
      &local_d0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_d0._M_dataplus._M_p._4_4_,local_d0._M_dataplus._M_p._0_4_),
                    local_d0.field_2._M_allocated_capacity + 1);
  }
  if (0 < numArgs) {
    uVar2 = (ulong)(uint)numArgs;
    do {
      local_d0._M_dataplus._M_p._0_4_ = 1;
      local_d4 = 0;
      std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
      emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
                ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_48,args,
                 (Delimiter *)&local_d0,&local_d4);
      args = args + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  local_d0._M_dataplus._M_p._0_4_ = 0;
  bVar1 = cmMakefile::ExecuteCommand
                    (local_b0,(cmListFileFunction *)local_a8,(cmExecutionStatus *)&local_d0);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_48);
  if ((undefined1 *)local_a8._32_8_ != local_a8 + 0x30) {
    operator_delete((void *)local_a8._32_8_,CONCAT71(local_a8._49_7_,local_a8[0x30]) + 1);
  }
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
  }
  return (int)bVar1;
}

Assistant:

int CCONV cmExecuteCommand(void* arg, const char* name, int numArgs,
                           const char** args)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmListFileFunction lff;
  lff.Name = name;
  for (int i = 0; i < numArgs; ++i) {
    // Assume all arguments are quoted.
    lff.Arguments.emplace_back(args[i], cmListFileArgument::Quoted, 0);
  }
  cmExecutionStatus status;
  return mf->ExecuteCommand(lff, status);
}